

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_vararg.c
# Opt level: O0

int mpt_process_vararg(char *fmt,__va_list_tag *arg,_func_int_void_ptr_mpt_iterator_ptr *proc,
                      void *ctx)

{
  int local_a0;
  int ret;
  int type;
  iteratorVararg va;
  void *ctx_local;
  _func_int_void_ptr_mpt_iterator_ptr *proc_local;
  __va_list_tag *arg_local;
  char *fmt_local;
  
  if (proc == (_func_int_void_ptr_mpt_iterator_ptr *)0x0) {
    fmt_local._4_4_ = -1;
  }
  else {
    _ret = &mpt_process_vararg::ctl;
    va._it._vptr = (_mpt_vptr_iterator *)fmt;
    va.arg[0].reg_save_area = fmt;
    va.val._type = (mpt_type_t)ctx;
    if ((fmt == (char *)0x0) || (*fmt == '\0')) {
      va._buf[8] = '\0';
      va._buf[9] = '\0';
      va._buf[10] = '\0';
      va._buf[0xb] = '\0';
      va._buf[0xc] = '\0';
      va._buf[0xd] = '\0';
      va._buf[0xe] = '\0';
      va._buf[0xf] = '\0';
      va.val._addr = (void *)0x0;
      fmt_local._4_4_ = (*proc)(ctx,(mpt_iterator *)&ret);
    }
    else {
      va.arg[0].overflow_arg_area = arg->reg_save_area;
      va.fmt = *(char **)arg;
      va.arg[0]._0_8_ = arg->overflow_arg_area;
      va.org.arg[0].overflow_arg_area = arg->reg_save_area;
      va.org.fmt = *(char **)arg;
      va.org.arg[0]._0_8_ = arg->overflow_arg_area;
      local_a0 = _iteratorVarargNext((iteratorVararg *)&ret);
      if (-1 < local_a0) {
        local_a0 = (*proc)((void *)va.val._type,(mpt_iterator *)&ret);
      }
      fmt_local._4_4_ = local_a0;
    }
  }
  return fmt_local._4_4_;
}

Assistant:

extern int mpt_process_vararg(const char *fmt, va_list arg, int (*proc)(void *, MPT_INTERFACE(iterator) *), void *ctx)
{
	static const MPT_INTERFACE_VPTR(iterator) ctl = {
		iteratorVarargValue,
		iteratorVarargAdvance,
		iteratorVarargReset
	};
	struct iteratorVararg va;
	int type;
	int ret;
	
	if (!proc) {
		return MPT_ERROR(BadArgument);
	}
	va._it._vptr = &ctl;
	va.org.fmt = fmt;
	va.fmt = fmt;
	if (!fmt || !(type = *fmt)) {
		MPT_value_set(&va.val, 0, 0);
		return proc(ctx, &va._it);
	}
	va_copy(va.arg, arg);
	va_copy(va.org.arg, arg);
	if ((ret = _iteratorVarargNext(&va)) >= 0) {
		ret = proc(ctx, &va._it);
	}
	va_end(va.org.arg);
	va_end(va.arg);
	return ret;
}